

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

void __thiscall ON_PolyCurve::Dump(ON_PolyCurve *this,ON_TextLog *dump)

{
  uint uVar1;
  ON_Curve **ppOVar2;
  double *pdVar3;
  ON_Curve *pOVar4;
  double dVar5;
  bool bVar6;
  char *format;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ON_3dPoint segment_end;
  ON_3dPoint segment_start;
  ON_3dPoint local_88;
  double local_70;
  ON_3dPoint local_68;
  ON_3dPoint local_48;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_68.z = ON_3dPoint::UnsetPoint.z;
  local_68.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
  local_68.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
  local_68.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
  local_68.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
  local_88.z = ON_3dPoint::UnsetPoint.z;
  local_88.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
  local_88.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
  local_88.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
  local_88.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
  ON_TextLog::Print(dump,"ON_PolyCurve segment count = %d\n",(ulong)uVar1);
  ON_TextLog::PushIndent(dump);
  if (0 < (long)(int)uVar1) {
    uVar7 = 1;
    do {
      ppOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      if (ppOVar2[uVar7 - 1] == (ON_Curve *)0x0) {
        local_68.z = ON_3dPoint::UnsetPoint.z;
        local_68.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
        local_68.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
        local_68.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
        local_68.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
      }
      else {
        ON_Curve::PointAtStart(&local_48,ppOVar2[uVar7 - 1]);
        local_68.z = local_48.z;
        local_68.x._0_4_ = local_48.x._0_4_;
        local_68.x._4_4_ = local_48.x._4_4_;
        local_68.y._0_4_ = local_48.y._0_4_;
        local_68.y._4_4_ = local_48.y._4_4_;
      }
      bVar6 = ON_3dPoint::IsValid(&local_68);
      uVar8 = 0x9e331dd2;
      uVar9 = 0xffe5f8bd;
      if (bVar6) {
        bVar6 = ON_3dPoint::IsValid(&local_88);
        uVar8 = 0x9e331dd2;
        uVar9 = 0xffe5f8bd;
        if (bVar6) {
          dVar5 = ON_3dPoint::DistanceTo(&local_68,&local_88);
          uVar8 = SUB84(dVar5,0);
          uVar9 = (undefined4)((ulong)dVar5 >> 0x20);
        }
      }
      local_70 = (double)CONCAT44(uVar9,uVar8);
      pdVar3 = (this->m_t).m_a;
      ON_TextLog::Print(dump,"Segment %d: (%g,%g)",SUB84(pdVar3[uVar7 - 1],0),pdVar3[uVar7],
                        uVar7 & 0xffffffff);
      if (uVar7 != 1) {
        bVar6 = ON_IsValid(local_70);
        if (bVar6) {
          ON_TextLog::Print(dump," gap = %.17g",SUB84(local_70,0));
        }
        else {
          bVar6 = ON_3dPoint::IsValid(&local_68);
          if (bVar6) {
            bVar6 = ON_3dPoint::IsValid(&local_88);
            if (bVar6) goto LAB_0058e718;
            format = " invalid previous segment curve";
          }
          else {
            format = " invalid segment curve";
          }
          ON_TextLog::Print(dump,format);
        }
      }
LAB_0058e718:
      ON_TextLog::Print(dump,"\n");
      ON_TextLog::PushIndent(dump);
      pOVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7 - 1];
      if (pOVar4 == (ON_Curve *)0x0) {
        ON_TextLog::Print(dump,"null curve pointer\n");
        local_88.z = ON_3dPoint::UnsetPoint.z;
        local_88.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
        local_88.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
        local_88.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
        local_88.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
      }
      else {
        (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])(pOVar4,dump);
        ON_Curve::PointAtEnd
                  (&local_48,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7 - 1]);
        local_88.z = local_48.z;
        local_88.x._0_4_ = local_48.x._0_4_;
        local_88.x._4_4_ = local_48.x._4_4_;
        local_88.y._0_4_ = local_48.y._0_4_;
        local_88.y._4_4_ = local_48.y._4_4_;
      }
      ON_TextLog::PopIndent(dump);
      bVar6 = uVar7 != (long)(int)uVar1;
      uVar7 = uVar7 + 1;
    } while (bVar6);
  }
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_PolyCurve::Dump( ON_TextLog& dump ) const
{
  const int count = Count();
  int i;

  ON_3dPoint segment_start = ON_3dPoint::UnsetPoint;
  ON_3dPoint segment_end = ON_3dPoint::UnsetPoint;
  double gap;

  dump.Print( "ON_PolyCurve segment count = %d\n", count );
  dump.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    if ( 0 != m_segment[i] )
      segment_start = m_segment[i]->PointAtStart();
    else
      segment_start = ON_3dPoint::UnsetPoint;
    gap = (segment_start.IsValid() && segment_end.IsValid())
        ? segment_start.DistanceTo(segment_end)
        : ON_UNSET_VALUE;
    dump.Print( "Segment %d: (%g,%g)", i+1, m_t[i], m_t[i+1] );
    if ( i > 0 )
    {
      if ( ON_IsValid(gap) )
        dump.Print(" gap = %.17g",gap);
      else if ( !segment_start.IsValid() )
        dump.Print(" invalid segment curve");
      else if ( !segment_end.IsValid() )
        dump.Print(" invalid previous segment curve");
    }
    dump.Print("\n");

    dump.PushIndent();
    if ( 0 == m_segment[i] )
    {
      dump.Print("null curve pointer\n");
      segment_end = ON_3dPoint::UnsetPoint;
    }
    else
    {
      m_segment[i]->Dump(dump);
      segment_end = m_segment[i]->PointAtEnd();
    }
    dump.PopIndent();
  }
  dump.PopIndent();
}